

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::~BuildSystemFrontendDelegate
          (BuildSystemFrontendDelegate *this)

{
  BuildSystemFrontendDelegateImpl *this_00;
  BuildSystemFrontendDelegate *this_local;
  
  (this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate =
       (_func_int **)&PTR__BuildSystemFrontendDelegate_003e1710;
  this_00 = (BuildSystemFrontendDelegateImpl *)this->impl;
  if (this_00 != (BuildSystemFrontendDelegateImpl *)0x0) {
    anon_unknown.dwarf_19a3b2::BuildSystemFrontendDelegateImpl::~BuildSystemFrontendDelegateImpl
              (this_00);
    operator_delete(this_00,0x78);
  }
  BuildSystemDelegate::~BuildSystemDelegate(&this->super_BuildSystemDelegate);
  return;
}

Assistant:

BuildSystemFrontendDelegate::~BuildSystemFrontendDelegate() {
  delete static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
}